

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int listen_port_00;
  ostream *poVar1;
  exception *e;
  Server server;
  int listen_port;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Invalid arguments! Usage: ");
    poVar1 = std::operator<<(poVar1,*argv);
    poVar1 = std::operator<<(poVar1," listen_port");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  listen_port_00 = Utils::parse_port(argv[1]);
  Server::Server((Server *)&e,listen_port_00);
  Server::run((Server *)&e);
  Server::~Server((Server *)&e);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

    if (argc != 2) {
        std::cerr << "Invalid arguments! Usage: " << argv[0] << " listen_port" << std::endl;
        exit(EXIT_SUCCESS);
    }

    try {
        int listen_port = Utils::parse_port(argv[LISTEN_PORT]);
        Server server(listen_port);
        server.run();
    } catch (std::exception& e) {
        std::cerr << e.what() << std::endl;
    }
    return 0;
}